

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O0

int coda_get_params_buf(coda_params_t *params,char *s,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  long in_RDX;
  char *in_RSI;
  string key;
  char *equ;
  char *amp;
  char *e;
  allocator local_59;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  char *local_30;
  char *local_18;
  int local_4;
  
  if (in_RSI == (char *)0x0) {
    local_4 = -1;
  }
  else {
    pcVar1 = in_RSI + in_RDX;
    local_18 = in_RSI;
    while (local_18 < pcVar1) {
      local_30 = coda_strnchr(local_18,'&',(long)pcVar1 - (long)local_18);
      if (local_30 == (char *)0x0) {
        local_30 = pcVar1;
      }
      pcVar2 = coda_strnchr(local_18,'=',(long)pcVar1 - (long)local_18);
      if ((pcVar2 != (char *)0x0) && (pcVar2 < local_30)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffa8,local_18,(long)pcVar2 - (long)local_18,
                   &local_59);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::__cxx11::string::assign((char *)pmVar3,(ulong)(pcVar2 + 1));
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      }
      local_18 = local_30 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int coda_get_params_buf(coda_params_t& params, const char* s, size_t len)
{
	if (!s) return -1;

	const char* e = s + len;

	while (s < e)
	{
		const char* amp = coda_strnchr(s, '&', e - s);
		if (NULL == amp) amp = e;

		const char* equ = coda_strnchr(s, '=', e - s);
		if (NULL != equ && equ < amp)
		{
			std::string key (s, equ - s);
			params[key].assign(equ + 1, amp - equ - 1);
		}

		s = amp + 1;
	}

	return 0;
}